

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::CheckLegalityAndFoldPathDepBranches(BasicBlock *this,GlobOpt *globOpt)

{
  Loop *this_00;
  Func *func;
  code *pcVar1;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  bool bVar2;
  IRKind IVar3;
  BOOLEAN BVar4;
  BVIndex i;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32 offset;
  Instr *pIVar9;
  undefined4 *puVar10;
  JitArenaAllocator *alloc;
  Opnd *pOVar11;
  RegOpnd *this_02;
  StackSym *pSVar12;
  Value *pVVar13;
  Value **ppVVar14;
  BranchInstr *pBVar15;
  LabelInstr *pLVar16;
  BasicBlock *pBVar17;
  JITTimeFunctionBody *this_03;
  char16 *pcVar18;
  ByteCodeUsesInstr *instr_00;
  Instr *instr_01;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_04;
  Type *ppFVar19;
  BasicBlock *pBVar20;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar21;
  uint local_194;
  bool local_169;
  bool local_159;
  Instr *local_140;
  BasicBlock *blockSucc;
  FlowEdge **__edge;
  EditingIterator iter;
  BranchInstr *newBranch;
  Instr *emptyByteCodeUse;
  Instr *lastInstr;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BasicBlock *pBStack_d0;
  BVIndex id;
  LabelInstr *branchTarget;
  BranchInstr *branch;
  Value **localDstValue;
  Value *dstValue;
  RegOpnd *dst;
  TrackAllocData local_98;
  BasicBlock *local_70;
  Instr *instr;
  Instr *instr_1;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  BVSparse<Memory::JitArenaAllocator> *currentPathDefines;
  GlobHashTable *localSymToValueMap;
  Instr *unskippedInlineeEnd;
  Instr *currentInlineeEnd;
  LabelInstr *lastBranchTarget;
  GlobOpt *globOpt_local;
  BasicBlock *this_local;
  BasicBlock *local_10;
  
  currentInlineeEnd = (Instr *)0x0;
  unskippedInlineeEnd = (Instr *)0x0;
  localSymToValueMap = (GlobHashTable *)0x0;
  currentPathDefines = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  __prevInstrCheck = (Instr *)0x0;
  instrStop = (Instr *)0x0;
  lastBranchTarget = (LabelInstr *)globOpt;
  globOpt_local = (GlobOpt *)this;
  pIVar9 = GetLastInstr(this);
  if (pIVar9 == (Instr *)0x0) {
    local_140 = (Instr *)0x0;
  }
  else {
    pIVar9 = GetLastInstr(this);
    local_140 = pIVar9->m_next;
  }
  instr_1 = local_140;
  for (instr = GetFirstInstr(this); instr != instr_1; instr = instr->m_next) {
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != instr)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1250,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    instrStop = instr;
    bVar2 = OpCodeAttr::HasDeadFallThrough(instr->m_opcode);
    if (bVar2) {
      return;
    }
    if (instr->m_opcode == InlineeEnd) {
      unskippedInlineeEnd = instr;
      localSymToValueMap = (GlobHashTable *)instr;
    }
  }
  local_70 = (BasicBlock *)GetLastInstr(this);
  bVar2 = IsLegalForPathDepBranches((Instr *)local_70);
  if (!bVar2) {
    return;
  }
  currentPathDefines =
       (BVSparse<Memory::JitArenaAllocator> *)
       ValueHashTable<Sym_*,_Value_*>::New((JitArenaAllocator *)lastBranchTarget->m_loop,8);
  this_00 = lastBranchTarget->m_loop;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
             ,0x1266);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     &local_98);
  pIVar9 = (Instr *)new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)pIVar9,
             (JitArenaAllocator *)lastBranchTarget->m_loop);
  __prevInstrCheck = pIVar9;
LAB_0053c3a0:
  do {
    while( true ) {
      if (local_70 == (BasicBlock *)0x0) {
        return;
      }
      bVar2 = IR::Instr::IsBranchInstr((Instr *)local_70);
      pBVar17 = local_70;
      if (!bVar2) {
        local_10 = local_70;
        IVar3 = IR::Instr::GetKind((Instr *)local_70);
        local_159 = true;
        if (IVar3 != InstrKindLabel) {
          local_159 = IR::Instr::IsProfiledLabelInstr((Instr *)pBVar17);
        }
        if ((local_159 == false) &&
           (bVar2 = IsLegalOpcodeForPathDepBrFold((Instr *)local_70), !bVar2)) {
          return;
        }
      }
      bVar2 = OpCodeAttr::HasDeadFallThrough(*(OpCode *)&local_70->upwardExposedFields);
      pBVar17 = local_70;
      if (bVar2) {
        return;
      }
      this_local = local_70;
      IVar3 = IR::Instr::GetKind((Instr *)local_70);
      local_169 = true;
      if (IVar3 != InstrKindLabel) {
        local_169 = IR::Instr::IsProfiledLabelInstr((Instr *)pBVar17);
      }
      if ((local_169 != false) &&
         (pLVar16 = IR::Instr::AsLabelInstr((Instr *)local_70), (pLVar16->field_0x78 & 1) != 0)) {
        return;
      }
      if (*(OpCode *)&local_70->upwardExposedFields == InlineeEnd) {
        if (unskippedInlineeEnd != (Instr *)0x0) {
          return;
        }
        unskippedInlineeEnd = (Instr *)local_70;
      }
      else {
        pOVar11 = IR::Instr::GetDst((Instr *)local_70);
        if (pOVar11 != (Opnd *)0x0) {
          pOVar11 = IR::Instr::GetDst((Instr *)local_70);
          bVar2 = IR::Opnd::IsRegOpnd(pOVar11);
          if (!bVar2) {
            return;
          }
          pOVar11 = IR::Instr::GetDst((Instr *)local_70);
          this_02 = IR::Opnd::AsRegOpnd(pOVar11);
          pIVar9 = __prevInstrCheck;
          pSVar12 = IR::Opnd::GetStackSym(&this_02->super_Opnd);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)pIVar9,(pSVar12->super_Sym).m_id);
          bVar2 = IsCopyTypeInstr((Instr *)local_70);
          this_01 = currentPathDefines;
          if (bVar2) {
            pVVar13 = UpdateValueForCopyTypeInstr
                                (this,(GlobOpt *)lastBranchTarget,
                                 (GlobHashTable *)currentPathDefines,(Instr *)local_70);
            if ((*(OpCode *)&local_70->upwardExposedFields == LdFld) && (pVVar13 == (Value *)0x0)) {
              return;
            }
          }
          else {
            pOVar11 = IR::Instr::GetDst((Instr *)local_70);
            pSVar12 = IR::Opnd::GetStackSym(pOVar11);
            ppVVar14 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew
                                 ((ValueHashTable<Sym_*,_Value_*> *)this_01,&pSVar12->super_Sym);
            *ppVVar14 = (Value *)0x0;
          }
        }
      }
      bVar2 = IR::Instr::IsBranchInstr((Instr *)local_70);
      if (bVar2) break;
      local_70 = (BasicBlock *)local_70->loop;
    }
    pBVar15 = IR::Instr::AsBranchInstr((Instr *)local_70);
    bVar2 = IR::BranchInstr::IsUnconditional(pBVar15);
    if (bVar2) {
      pBStack_d0 = (BasicBlock *)IR::BranchInstr::GetTarget(pBVar15);
      if (pBStack_d0 == (BasicBlock *)0x0) {
        return;
      }
      if (((ulong)pBStack_d0->stackSymToGuardedProperties & 1) != 0) {
        return;
      }
    }
    else {
      pLVar16 = IR::BranchInstr::GetTarget(pBVar15);
      if ((pLVar16->field_0x78 & 1) != 0) {
        return;
      }
      pBStack_d0 = (BasicBlock *)
                   CanProveConditionalBranch
                             (this,pBVar15,(GlobOpt *)lastBranchTarget,
                              (GlobHashTable *)currentPathDefines);
      if (pBStack_d0 == (BasicBlock *)0x0) {
        return;
      }
    }
    for (__startIndex = __prevInstrCheck->_vptr_Instr; __startIndex != (_func_int **)0x0;
        __startIndex = (_func_int **)*__startIndex) {
      _unit.word._0_4_ = *(int *)(__startIndex + 1);
      lastInstr = (Instr *)__startIndex[2];
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&lastInstr);
      while (_unit.word._4_4_ != 0xffffffff) {
        i = (int)_unit.word + _unit.word._4_4_;
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&lastInstr,_unit.word._4_4_);
        pBVar17 = IR::LabelInstr::GetBasicBlock((LabelInstr *)pBStack_d0);
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar17->upwardExposedUses,i);
        if (BVar4 != '\0') {
          return;
        }
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&lastInstr);
      }
      if (__startIndex == (_func_int **)0x0) break;
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PathDepBranchFoldingPhase,uVar5,uVar6);
    if ((bVar2) && (bVar2 = IR::BranchInstr::IsUnconditional(pBVar15), !bVar2)) {
      Output::Print(L"TRACE PathDependentBranchFolding: ");
      uVar7 = GetBlockNum(this);
      pIVar9 = GetLastInstr(this);
      bVar2 = IR::Instr::IsBranchInstr(pIVar9);
      if (bVar2) {
        pIVar9 = GetLastInstr(this);
        pBVar15 = IR::Instr::AsBranchInstr(pIVar9);
        pLVar16 = IR::BranchInstr::GetTarget(pBVar15);
        pBVar17 = IR::LabelInstr::GetBasicBlock(pLVar16);
        local_194 = GetBlockNum(pBVar17);
      }
      else {
        pBVar17 = GetNext(this);
        local_194 = GetBlockNum(pBVar17);
      }
      pBVar17 = IR::LabelInstr::GetBasicBlock((LabelInstr *)pBStack_d0);
      uVar8 = GetBlockNum(pBVar17);
      this_03 = Func::GetJITFunctionBody(this->func);
      pcVar18 = JITTimeFunctionBody::GetDisplayName(this_03);
      Output::Print(L"Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"
                    ,(ulong)uVar7,(ulong)local_194,(ulong)uVar8,pcVar18);
      bVar2 = GlobOpt::IsLoopPrePass((GlobOpt *)lastBranchTarget);
      if (bVar2) {
        Output::Print(L"In LoopPrePass\n");
      }
      Output::Flush();
    }
    pIVar9 = GetLastInstr(this);
    bVar2 = IR::Instr::IsBranchInstr(pIVar9);
    if (!bVar2) {
LAB_0053c917:
      pIVar9 = GetLastInstr(this);
      pBVar17 = (BasicBlock *)IR::Instr::GetNextRealInstrOrLabel(pIVar9);
      pLVar16 = lastBranchTarget;
      if (pBStack_d0 == pBVar17) {
        pIVar9 = GetLastInstr(this);
        GlobOpt::ConvertToByteCodeUses((GlobOpt *)pLVar16,pIVar9);
      }
      else {
        pIVar9 = GetLastInstr(this);
        func = pIVar9->m_func;
        offset = IR::Instr::GetByteCodeOffset(pIVar9);
        instr_00 = IR::ByteCodeUsesInstr::New(func,offset);
        IR::Instr::InsertAfter(pIVar9,&instr_00->super_Instr);
        iter.last = (NodeBase *)
                    IR::BranchInstr::New
                              (Br,(LabelInstr *)pBStack_d0,
                               (Func *)(((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                                        &pBStack_d0->liveFixedFields)->
                                       super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>
                                       ).super_SListNodeBase<Memory::ArenaAllocator>.next);
        bVar2 = IR::Instr::IsBranchInstr(pIVar9);
        if (bVar2) {
          GlobOpt::ConvertToByteCodeUses((GlobOpt *)lastBranchTarget,pIVar9);
        }
        IR::Instr::InsertAfter(&instr_00->super_Instr,(Instr *)iter.last);
        pLVar16 = lastBranchTarget->m_region[4].bailoutReturnThunkLabel;
        pBVar17 = IR::LabelInstr::GetBasicBlock((LabelInstr *)pBStack_d0);
        FlowGraph::AddEdge((FlowGraph *)pLVar16,this,pBVar17);
        IncrementDataUseCount(this);
      }
      if ((unskippedInlineeEnd != (Instr *)0x0) &&
         (unskippedInlineeEnd != (Instr *)localSymToValueMap)) {
        pIVar9 = GetLastInstr(this);
        instr_01 = IR::Instr::Copy(unskippedInlineeEnd,true);
        IR::Instr::InsertBefore(pIVar9,instr_01);
        GlobOpt::ProcessInlineeEnd((GlobOpt *)lastBranchTarget,unskippedInlineeEnd);
        unskippedInlineeEnd = (Instr *)0x0;
      }
      this_04 = &GetSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                ((EditingIterator *)&__edge,this_04);
      while (bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                               ((EditingIterator *)&__edge), bVar2) {
        ppFVar19 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&__edge);
        pBVar17 = FlowEdge::GetSucc(*ppFVar19);
        if (pBVar17 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x12fc,"(blockSucc)","blockSucc");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pIVar9 = GetFirstInstr(pBVar17);
        pBVar20 = (BasicBlock *)IR::Instr::AsLabelInstr(pIVar9);
        if (pBStack_d0 != pBVar20) {
          RemoveDeadSucc(this,pBVar17,
                         (FlowGraph *)lastBranchTarget->m_region[4].bailoutReturnThunkLabel);
          uVar5 = GetDataUseCount(this);
          if (uVar5 != 0) {
            DecrementDataUseCount(this);
          }
          pSVar21 = GetPredList(pBVar17);
          uVar5 = RealCount::Count(&(pSVar21->
                                    super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                                    super_RealCount);
          if (uVar5 == 0) {
            FlowGraph::RemoveBlock(this->func->m_fg,pBVar17,(GlobOpt *)lastBranchTarget,false);
          }
        }
      }
      currentInlineeEnd = (Instr *)pBStack_d0;
      local_70 = pBStack_d0;
      uVar5 = Func::GetSourceContextId
                        ((Func *)(((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                                  &pBStack_d0->liveFixedFields)->
                                 super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>).
                                 super_SListNodeBase<Memory::ArenaAllocator>.next);
      uVar6 = Func::GetLocalFunctionId
                        ((Func *)(((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                                  &local_70->liveFixedFields)->
                                 super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>).
                                 super_SListNodeBase<Memory::ArenaAllocator>.next);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PathDepBranchFoldingPhase,uVar5,uVar6);
      if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
        Output::Print(L"After PathDependentBranchFolding: ");
        Func::Dump(this->func);
      }
      goto LAB_0053c3a0;
    }
    pIVar9 = GetLastInstr(this);
    pBVar15 = IR::Instr::AsBranchInstr(pIVar9);
    pBVar17 = (BasicBlock *)IR::BranchInstr::GetTarget(pBVar15);
    if (pBVar17 != pBStack_d0) goto LAB_0053c917;
    currentInlineeEnd = (Instr *)pBStack_d0;
    local_70 = pBStack_d0;
  } while( true );
}

Assistant:

void
BasicBlock::CheckLegalityAndFoldPathDepBranches(GlobOpt* globOpt)
{
    IR::LabelInstr * lastBranchTarget = nullptr;
    IR::Instr *currentInlineeEnd = nullptr, *unskippedInlineeEnd = nullptr;
    GlobHashTable * localSymToValueMap = nullptr;
    BVSparse<JitArenaAllocator> * currentPathDefines = nullptr;

    FOREACH_INSTR_IN_BLOCK(instr, this)
    {
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode))
        {
            return;
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            unskippedInlineeEnd = currentInlineeEnd = instr;
        }
    } NEXT_INSTR_IN_BLOCK;

    IR::Instr * instr = this->GetLastInstr();

    // We have to first check the legality and only then allocate expensive data structures on the tempArena, because most block will have instructions we cant skip
    if (!IsLegalForPathDepBranches(instr))
    {
        return;
    }

    // Allocate hefty structures, we will not free them because OptBlock does a Reset on the tempAlloc
    localSymToValueMap = GlobHashTable::New(globOpt->tempAlloc, 8);
    currentPathDefines = JitAnew(globOpt->tempAlloc, BVSparse<JitArenaAllocator>, globOpt->tempAlloc);

    /* We start from the current instruction and go on scanning for legality, as long as it is legal to skip an instruction, skip.
     * When we see an unconditional branch, start scanning from the branchTarget
     * When we see a conditional branch, check if we can prove the branch target, if we can, adjust the flowgraph, and continue in the direction of the proven target
     * We stop, when we no longer can skip instructions, either due to legality check or a non provable conditional branch
    */
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return;
        }
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode)) // BailOnNoProfile etc
        {
            return;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return;
            }
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            if (currentInlineeEnd != nullptr)
            {
                return;
            }
            currentInlineeEnd = instr;
        }
        else if (instr->GetDst())
        {
            if (!instr->GetDst()->IsRegOpnd()) // complex dstOpnd, stop.
            {
                return;
            }

            IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
            currentPathDefines->Set(dst->GetStackSym()->m_id);

            if (IsCopyTypeInstr(instr))
            {
                Value *dstValue = UpdateValueForCopyTypeInstr(globOpt, localSymToValueMap, instr);
                if (instr->m_opcode == Js::OpCode::LdFld && !dstValue)
                {
                    // We cannot skip a LdFld if we didnt find its valueInfo in the localValueTable
                    return;
                }
            }
            else
            {
                Value ** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                *localDstValue = nullptr;
            }
        }

        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            IR::LabelInstr* branchTarget = nullptr;

            if (branch->IsUnconditional())
            {
                branchTarget = branch->GetTarget();
                if (!branchTarget)
                {
                    return;
                }
                if (branchTarget->m_isLoopTop)
                {
                    return;
                }
            }
            else
            {
                if (branch->GetTarget()->m_isLoopTop)
                {
                    return;
                }
                branchTarget = CanProveConditionalBranch(branch, globOpt, localSymToValueMap);
                if (!branchTarget)
                {
                    return;
                }
            }

            FOREACH_BITSET_IN_SPARSEBV(id, currentPathDefines)
            {
                if (branchTarget->GetBasicBlock()->upwardExposedUses->Test(id))
                {
                    // it is used in the direction of the branch, we can't skip it
                    return;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, this->func))
            {
                if (!branch->IsUnconditional())
                {
                    Output::Print(_u("TRACE PathDependentBranchFolding: "));
                    Output::Print(_u("Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"),
                        this->GetBlockNum(),
                        this->GetLastInstr()->IsBranchInstr() ? this->GetLastInstr()->AsBranchInstr()->GetTarget()->GetBasicBlock()->GetBlockNum() : this->GetNext()->GetBlockNum(),
                        branchTarget->GetBasicBlock()->GetBlockNum(),
                        this->func->GetJITFunctionBody()->GetDisplayName());
                    if (globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("In LoopPrePass\n"));
                    }
                    Output::Flush();
                }
            }

            if (this->GetLastInstr()->IsBranchInstr() && (this->GetLastInstr()->AsBranchInstr()->GetTarget() == branchTarget))
            {
                // happens on the first block we start from only
                lastBranchTarget = branchTarget;
                instr = lastBranchTarget;
                continue;
            }
            if (branchTarget != this->GetLastInstr()->GetNextRealInstrOrLabel())
            {
                IR::Instr* lastInstr = this->GetLastInstr();
                // We add an empty ByteCodeUses with correct bytecodeoffset, for correct info on a post-op bailout of the previous instr
                IR::Instr* emptyByteCodeUse = IR::ByteCodeUsesInstr::New(lastInstr->m_func, lastInstr->GetByteCodeOffset());
                lastInstr->InsertAfter(emptyByteCodeUse);
                IR::BranchInstr * newBranch = IR::BranchInstr::New(Js::OpCode::Br, branchTarget, branchTarget->m_func);
                if (lastInstr->IsBranchInstr())
                {
                    globOpt->ConvertToByteCodeUses(lastInstr);
                }
                emptyByteCodeUse->InsertAfter(newBranch);
                globOpt->func->m_fg->AddEdge(this, branchTarget->GetBasicBlock());
                this->IncrementDataUseCount();
            }
            else
            {
                // If the new target is a fall through label, delete the branch
                globOpt->ConvertToByteCodeUses(this->GetLastInstr());
            }
            if (currentInlineeEnd != nullptr && currentInlineeEnd != unskippedInlineeEnd)
            {
                this->GetLastInstr()->InsertBefore(currentInlineeEnd->Copy());
                globOpt->ProcessInlineeEnd(currentInlineeEnd);
                currentInlineeEnd = nullptr;
            }
            // We are adding an unconditional branch, go over all the current successors and remove the ones that are dead now
            FOREACH_SUCCESSOR_BLOCK_EDITING(blockSucc, this, iter)
            {
                if (branchTarget != blockSucc->GetFirstInstr()->AsLabelInstr())
                {
                    // Change the old succ edge to dead
                    this->RemoveDeadSucc(blockSucc, globOpt->func->m_fg);
                    if (this->GetDataUseCount() > 0)
                    {
                        this->DecrementDataUseCount();
                    }
                    if (blockSucc->GetPredList()->Count() == 0)
                    {
                        this->func->m_fg->RemoveBlock(blockSucc, globOpt);
                    }
                }
            }NEXT_SUCCESSOR_BLOCK_EDITING;
            lastBranchTarget = branchTarget;
            instr = lastBranchTarget;
#if DBG
            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("After PathDependentBranchFolding: "));
                this->func->Dump();
            }
#endif
        }
        else
        {
            instr = instr->m_next;
        }
    }

    return;
}